

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveDifferentArenas_Test::
MovableMessageTest_MoveDifferentArenas_Test(MovableMessageTest_MoveDifferentArenas_Test *this)

{
  MovableMessageTest_MoveDifferentArenas_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__MovableMessageTest_MoveDifferentArenas_Test_02a03180;
  return;
}

Assistant:

TEST(MovableMessageTest, MoveDifferentArenas) {
  Arena arena1, arena2;

  auto* message1_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena1);
  TestUtil::SetAllFields(message1_on_arena);
  const auto* nested = &message1_on_arena->optional_nested_message();

  auto* message2_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena2);

  // Moving messages on two different arenas should lead to a copy.
  *message2_on_arena = std::move(*message1_on_arena);
  EXPECT_NE(nested, &message2_on_arena->optional_nested_message());
  TestUtil::ExpectAllFieldsSet(*message1_on_arena);
  TestUtil::ExpectAllFieldsSet(*message2_on_arena);
}